

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O1

void __thiscall soplex::SPxBasisBase<double>::addedCols(SPxBasisBase<double> *this,int n)

{
  int iVar1;
  SPxId *pSVar2;
  int iVar3;
  Status SVar4;
  uint uVar5;
  undefined8 *puVar6;
  SPxStatus SVar7;
  SPxSolverBase<double> *theLP;
  long lVar8;
  DataKey local_50;
  long local_48;
  undefined1 local_40 [16];
  DataKey local_30;
  
  if (0 < n) {
    reDim(this);
    theLP = this->theLP;
    iVar1 = (theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
            thenum;
    iVar3 = iVar1 - n;
    if (theLP->theRep == ROW) {
      if (iVar3 < iVar1) {
        lVar8 = (long)iVar3;
        do {
          SVar4 = primalColStatus<double>((int)lVar8,&theLP->super_SPxLPBase<double>);
          (this->thedesc).colstat.data[lVar8] = SVar4;
          local_30 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                     super_SVSetBase<double>.set.thekey[lVar8];
          SPxColId::SPxColId((SPxColId *)&local_50,&local_30);
          pSVar2 = (this->theBaseId).data;
          pSVar2[lVar8].super_DataKey = local_50;
          pSVar2[lVar8].super_DataKey.info = 1;
          lVar8 = lVar8 + 1;
          theLP = this->theLP;
        } while (lVar8 < (theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                         super_SVSetBase<double>.set.thenum);
      }
    }
    else if (iVar3 < iVar1) {
      lVar8 = (long)iVar3;
      do {
        SVar4 = primalColStatus<double>((int)lVar8,&theLP->super_SPxLPBase<double>);
        (this->thedesc).colstat.data[lVar8] = SVar4;
        lVar8 = lVar8 + 1;
        theLP = this->theLP;
      } while (lVar8 < (theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum);
    }
    if ((NO_PROBLEM < this->thestatus) && (this->matrixIsSetup == true)) {
      loadMatrixVecs(this);
    }
    uVar5 = this->thestatus + PRIMAL;
    if (7 < uVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ECHBAS08 Unknown basis status!",0x1e);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_50 = (DataKey)local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"XCHBAS02 This should never happen.","");
      *puVar6 = &PTR__SPxException_006a9ee8;
      puVar6[1] = puVar6 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar6 + 1),local_50,(undefined1 *)(local_48 + (long)local_50));
      *puVar6 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    if ((0x17U >> (uVar5 & 0x1f) & 1) == 0) {
      SVar7 = REGULAR;
      if ((0x60U >> (uVar5 & 0x1f) & 1) != 0) {
        SVar7 = PRIMAL;
      }
      this->thestatus = SVar7;
    }
  }
  return;
}

Assistant:

void SPxBasisBase<R>::addedCols(int n)
{
   assert(theLP != nullptr);

   if(n > 0)
   {
      reDim();

      if(theLP->rep() == SPxSolverBase<R>::ROW)
      {
         /* after adding columns in row representation, reDim() should set these bools to false. */
         assert(!matrixIsSetup && !factorized);

         for(int i = theLP->nCols() - n; i < theLP->nCols(); ++i)
         {
            thedesc.colStatus(i) = primalColStatus(i, theLP);
            baseId(i) = theLP->SPxLPBase<R>::cId(i);
         }
      }
      else
      {
         assert(theLP->rep() == SPxSolverBase<R>::COLUMN);

         for(int i = theLP->nCols() - n; i < theLP->nCols(); ++i)
            thedesc.colStatus(i) = primalColStatus(i, theLP);
      }

      /* If matrix was set up, load new basis vectors to the matrix
       * In the column case, the basis is not effected by adding columns. However,
       * since @c matrix stores references to the columns in the LP (SPxLPBase<R>), a realloc
       * in SPxLPBase<R> (e.g. due to space requirements) might invalidate these references.
       * We therefore have to "reload" the matrix if it is set up. Note that reDim()
       * leaves @c matrixIsSetup untouched if only columns have been added, since the
       * basis matrix already has the correct size. */
      if(status() > NO_PROBLEM && matrixIsSetup)
         loadMatrixVecs();

      switch(status())
      {
      case DUAL:
      case INFEASIBLE:
         setStatus(REGULAR);
         break;

      case OPTIMAL:
      case UNBOUNDED:
         setStatus(PRIMAL);
         break;

      case NO_PROBLEM:
      case SINGULAR:
      case REGULAR:
      case PRIMAL:
         break;

      default:
         SPX_MSG_ERROR(std::cerr << "ECHBAS08 Unknown basis status!" << std::endl;)
         throw SPxInternalCodeException("XCHBAS02 This should never happen.");
      }
   }
}